

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O0

void __thiscall FIX::DataDictionary::readFromURL(DataDictionary *this,string *url)

{
  uint uVar1;
  PUGIXML_DOMDocument *this_00;
  pointer pDVar2;
  ConfigError *this_01;
  ConfigError *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  DOMDocumentPtr local_20;
  DOMDocumentPtr pDoc;
  string *url_local;
  DataDictionary *this_local;
  
  pDoc._M_t.super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
  super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
  super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl =
       (__uniq_ptr_data<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>,_true,_true>)
       (__uniq_ptr_data<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>,_true,_true>)url;
  this_00 = (PUGIXML_DOMDocument *)operator_new(0xd8);
  PUGIXML_DOMDocument::PUGIXML_DOMDocument(this_00);
  std::unique_ptr<FIX::DOMDocument,std::default_delete<FIX::DOMDocument>>::
  unique_ptr<std::default_delete<FIX::DOMDocument>,void>
            ((unique_ptr<FIX::DOMDocument,std::default_delete<FIX::DOMDocument>> *)&local_20,
             (pointer)this_00);
  pDVar2 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::operator->
                     ((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> *)
                      &local_20);
  uVar1 = (*pDVar2->_vptr_DOMDocument[3])
                    (pDVar2,pDoc._M_t.
                            super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                            .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl);
  if ((uVar1 & 1) == 0) {
    this_01 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   pDoc._M_t.
                   super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                   .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl,
                   ": Could not parse data dictionary file");
    ConfigError::ConfigError(this_01,&local_50);
    __cxa_throw(this_01,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  readFromDocument(this,&local_20);
  std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

EXCEPT(ConfigError) {
  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());

  if (!pDoc->load(url)) {
    throw ConfigError(url + ": Could not parse data dictionary file");
  }

  try {
    readFromDocument(pDoc);
  } catch (ConfigError &e) {
    throw ConfigError(url + ": " + e.what());
  }
}